

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_types.h
# Opt level: O2

void __thiscall Clasp::JumpStats::update(JumpStats *this,uint32 dl,uint32 uipLevel,uint32 bLevel)

{
  uint uVar1;
  uint uVar2;
  
  this->jumps = this->jumps + 1;
  uVar2 = dl - uipLevel;
  this->jumpSum = this->jumpSum + (ulong)uVar2;
  if (uVar2 < this->maxJump) {
    uVar2 = this->maxJump;
  }
  this->maxJump = uVar2;
  uVar1 = bLevel - uipLevel;
  if (uipLevel <= bLevel && uVar1 != 0) {
    this->bounded = this->bounded + 1;
    this->boundSum = this->boundSum + (ulong)uVar1;
    uVar2 = dl - bLevel;
    if (dl - bLevel < this->maxJumpEx) {
      uVar2 = this->maxJumpEx;
    }
    this->maxJumpEx = uVar2;
    if (uVar1 < this->maxBound) {
      uVar1 = this->maxBound;
    }
    this->maxBound = uVar1;
    return;
  }
  this->maxJumpEx = uVar2;
  return;
}

Assistant:

void update(uint32 dl, uint32 uipLevel, uint32 bLevel) {
		++jumps;
		jumpSum += dl - uipLevel;
		maxJump = std::max(maxJump, dl - uipLevel);
		if (uipLevel < bLevel) {
			++bounded;
			boundSum += bLevel - uipLevel;
			maxJumpEx = std::max(maxJumpEx, dl - bLevel);
			maxBound = std::max(maxBound, bLevel - uipLevel);
		}
		else { maxJumpEx = maxJump; }
	}